

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O2

void __thiscall
yamc::barrier<counting_completion>::arrive_and_wait(barrier<counting_completion> *this)

{
  uint uVar1;
  long lVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mtx_);
  if (0 < this->counter_) {
    uVar1 = this->phase_;
    lVar2 = this->counter_ + -1;
    this->counter_ = lVar2;
    if (lVar2 == 0) {
      phase_completion_step(this,false);
    }
    while (this->phase_ <= uVar1) {
      std::condition_variable::wait((unique_lock *)&this->cv_);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    return;
  }
  __assert_fail("0 < counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_barrier.hpp"
                ,0x80,
                "void yamc::barrier<counting_completion>::arrive_and_wait() [CompletionFunction = counting_completion]"
               );
}

Assistant:

void arrive_and_wait()
  {
    // equivalent to wait(arrive())
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    assert(0 < counter_);
    auto arrival_phase = phase_;
    counter_ -= 1;
    if (counter_ == 0) {
      phase_completion_step(false);
    }
    while (phase_ <= arrival_phase) {
      cv_.wait(lk);
    }
  }